

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbdif.cpp
# Opt level: O3

char * ask_user_string(char *szPrompt,char *szDefault)

{
  size_t sVar1;
  char *__dest;
  char enter [1024];
  undefined8 uStack_440;
  char local_438 [1032];
  
  uStack_440 = 0x15b9a1;
  memset(local_438,0,0x400);
  do {
    if (szDefault == (char *)0x0) {
      uStack_440 = 0x15b9d7;
      printf("%s: ",szPrompt);
    }
    else {
      uStack_440 = 0x15b9c4;
      printf("%s <%s>: ",szPrompt,szDefault);
    }
    uStack_440 = 0x15b9ef;
    fgets(local_438,0x3ff,_stdin);
    if (szDefault != (char *)0x0 && (local_438[0] == '\n' || local_438[0] == '\0'))
    goto LAB_0015ba26;
  } while (szDefault == (char *)0x0 && (local_438[0] == '\n' || local_438[0] == '\0'));
  uStack_440 = 0x15ba15;
  sVar1 = strlen(local_438);
  szDefault = local_438;
  if (local_438[sVar1 - 1] == '\n') {
    local_438[sVar1 - 1] = '\0';
    szDefault = local_438;
  }
LAB_0015ba26:
  uStack_440 = 0x15ba2e;
  sVar1 = strlen(szDefault);
  uStack_440 = 0x15ba37;
  __dest = (char *)operator_new__(sVar1 + 1);
  uStack_440 = 0x15ba45;
  strcpy(__dest,szDefault);
  return __dest;
}

Assistant:

char*
ask_user_string (const char* szPrompt, const char* szDefault)
{
    char    *szResult;
    char    enter[1024] = "";
 repeat_enter:
    if(NULL != szDefault)
      printf("%s <%s>: ", szPrompt, szDefault);
    else
      printf("%s: ", szPrompt);
    fgets(enter, sizeof(enter)-1, stdin);
    if(('\0' == enter[0] || '\n' == enter[0]) && NULL != szDefault)
      {
	szResult = new char[strlen(szDefault) + 1];
	strcpy(szResult, szDefault);
      }
    else if(('\0' == enter[0] || '\n' == enter[0]) && NULL == szDefault)
      {
	/* default value is not provided - repeat enter */
	goto repeat_enter;
      }
    else
      {
	if('\n' == enter[strlen(enter)-1])
	  enter[strlen(enter)-1] = '\0';
	szResult = new char[strlen(enter) + 1];
	strcpy(szResult, enter);
      }
    return szResult;
}